

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.c
# Opt level: O0

dictionary_t dictionary_open(char *filename,opencc_dictionary_type type)

{
  dictionary_t pvVar1;
  opencc_dictionary_type *local_20;
  dictionary_desc *dictionary;
  opencc_dictionary_type type_local;
  char *filename_local;
  
  local_20 = (opencc_dictionary_type *)malloc(0x10);
  *local_20 = type;
  if (type == OPENCC_DICTIONARY_TYPE_TEXT) {
    pvVar1 = dictionary_text_open(filename);
    *(dictionary_t *)(local_20 + 2) = pvVar1;
  }
  else if (type == OPENCC_DICTIONARY_TYPE_DATRIE) {
    pvVar1 = dictionary_datrie_open(filename);
    *(dictionary_t *)(local_20 + 2) = pvVar1;
  }
  else {
    free(local_20);
    local_20 = (opencc_dictionary_type *)0xffffffffffffffff;
  }
  return local_20;
}

Assistant:

dictionary_t dictionary_open(const char * filename, opencc_dictionary_type type)
{
	dictionary_desc * dictionary = (dictionary_desc *) malloc(sizeof(dictionary_desc));
	dictionary->type = type;
	switch (type)
	{
	case OPENCC_DICTIONARY_TYPE_TEXT:
		dictionary->dict = dictionary_text_open(filename);
		break;
	case OPENCC_DICTIONARY_TYPE_DATRIE:
		dictionary->dict = dictionary_datrie_open(filename);
		break;
	default:
		free(dictionary);
		dictionary = (dictionary_t) -1; /* TODO:辭典格式不支持 */
	}
	return dictionary;
}